

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O1

TestGeneratedValues *
duckdb::TestVectorFlat::GenerateValues
          (TestGeneratedValues *__return_storage_ptr__,TestVectorInfo *info)

{
  pointer pLVar1;
  pointer type;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_40 [24];
  
  (__return_storage_ptr__->column_values).
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->column_values).
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->column_values).
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  type = (info->types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
  pLVar1 = (info->types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (type != pLVar1) {
    do {
      GenerateValues((vector<duckdb::Value,_true> *)local_40,info,type);
      TestGeneratedValues::AddColumn(__return_storage_ptr__,(vector<duckdb::Value,_true> *)local_40)
      ;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_40);
      type = type + 1;
    } while (type != pLVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static TestGeneratedValues GenerateValues(TestVectorInfo &info) {
		// generate the values for each column
		TestGeneratedValues generated_values;
		for (auto &type : info.types) {
			generated_values.AddColumn(GenerateValues(info, type));
		}
		return generated_values;
	}